

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramInit(VP8LHistogram *p,int palette_code_bits,int init_arrays)

{
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0xca8) = in_ESI;
  if (in_EDX == 0) {
    *(undefined4 *)(in_RDI + 0xcac) = 0;
    *(undefined8 *)(in_RDI + 0xcb0) = 0;
    *(undefined8 *)(in_RDI + 0xcb8) = 0;
    *(undefined8 *)(in_RDI + 0xcc0) = 0;
    *(undefined8 *)(in_RDI + 0xcc8) = 0;
    memset((void *)(in_RDI + 0xcd0),0,5);
  }
  else {
    HistogramClear((VP8LHistogram *)CONCAT44(in_ESI,in_EDX));
  }
  return;
}

Assistant:

void VP8LHistogramInit(VP8LHistogram* const p, int palette_code_bits,
                       int init_arrays) {
  p->palette_code_bits_ = palette_code_bits;
  if (init_arrays) {
    HistogramClear(p);
  } else {
    p->trivial_symbol_ = 0;
    p->bit_cost_ = 0.;
    p->literal_cost_ = 0.;
    p->red_cost_ = 0.;
    p->blue_cost_ = 0.;
    memset(p->is_used_, 0, sizeof(p->is_used_));
  }
}